

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

int __thiscall
AddrInfo::GetNewBucket(AddrInfo *this,uint256 *nKey,CNetAddr *src,NetGroupManager *netgroupman)

{
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  CNetAddr *in_RDI;
  long in_FS_OFFSET;
  uint64_t hash2;
  uint64_t hash1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSourceGroupKey;
  HashWriter *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  HashWriter *in_stack_fffffffffffffe58;
  undefined4 local_160;
  NetGroupManager *in_stack_fffffffffffffee0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  NetGroupManager::GetGroup(in_stack_fffffffffffffee0,in_RDI);
  HashWriter::HashWriter(in_stack_fffffffffffffe48);
  HashWriter::operator<<
            (in_stack_fffffffffffffe58,
             (uint256 *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  NetGroupManager::GetGroup(in_stack_fffffffffffffee0,in_RDI);
  HashWriter::operator<<
            (in_stack_fffffffffffffe58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  HashWriter::operator<<
            (in_stack_fffffffffffffe58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  HashWriter::GetCheapHash(in_stack_fffffffffffffe58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe58);
  HashWriter::HashWriter(in_stack_fffffffffffffe48);
  HashWriter::operator<<
            (in_stack_fffffffffffffe58,
             (uint256 *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  HashWriter::operator<<
            (in_stack_fffffffffffffe58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  HashWriter::operator<<
            (in_stack_fffffffffffffe58,
             (unsigned_long *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            HashWriter::GetCheapHash(in_stack_fffffffffffffe58);
  local_160 = (uint)this_00;
  local_160 = local_160 & 0x3ff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_160;
  }
  __stack_chk_fail();
}

Assistant:

int AddrInfo::GetNewBucket(const uint256& nKey, const CNetAddr& src, const NetGroupManager& netgroupman) const
{
    std::vector<unsigned char> vchSourceGroupKey = netgroupman.GetGroup(src);
    uint64_t hash1 = (HashWriter{} << nKey << netgroupman.GetGroup(*this) << vchSourceGroupKey).GetCheapHash();
    uint64_t hash2 = (HashWriter{} << nKey << vchSourceGroupKey << (hash1 % ADDRMAN_NEW_BUCKETS_PER_SOURCE_GROUP)).GetCheapHash();
    return hash2 % ADDRMAN_NEW_BUCKET_COUNT;
}